

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testInit
          (SSBLayoutQualifierConflictTest *this)

{
  bool bVar1;
  GLuint stage_1;
  GLuint stage;
  long lVar2;
  GLuint qualifier;
  QUALIFIERS QVar3;
  testCase test_case;
  bool stage_support [6];
  value_type local_30;
  char acStack_26 [6];
  
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    bVar1 = isStageSupported(this,(STAGES)lVar2);
    acStack_26[lVar2] = bVar1;
  }
  for (QVar3 = DEFAULT; QVar3 != QUALIFIERS_MAX; QVar3 = QVar3 + STD140) {
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      if (acStack_26[lVar2] != '\0') {
        local_30.m_stage = (STAGES)lVar2;
        local_30.m_qualifier = QVar3;
        std::
        vector<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_30);
      }
    }
  }
  return;
}

Assistant:

void SSBLayoutQualifierConflictTest::testInit()
{
	bool stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (false == stage_support[stage])
			{
				continue;
			}

			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}